

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O1

void Test_TemplateModifiers_FindModifier::Run(void)

{
  char cVar1;
  long lVar2;
  undefined8 extraout_RAX;
  NullModifier foo_modifier4;
  NullModifier foo_modifier3;
  NullModifier foo_modifier2;
  NullModifier foo_modifier5;
  NullModifier foo_modifier1;
  code *local_50;
  code *local_48;
  code *local_40;
  code *local_38;
  code *local_30;
  
  lVar2 = ctemplate::FindModifier("html_escape",0xb,"",0);
  if (lVar2 == 0) {
    Run();
LAB_00114a1b:
    Run();
LAB_00114a20:
    Run();
LAB_00114a25:
    Run();
LAB_00114a2a:
    Run();
LAB_00114a2f:
    Run();
LAB_00114a34:
    Run();
LAB_00114a39:
    Run();
LAB_00114a3e:
    Run();
LAB_00114a43:
    Run();
LAB_00114a48:
    Run();
LAB_00114a4d:
    Run();
LAB_00114a52:
    Run();
LAB_00114a57:
    Run();
LAB_00114a5c:
    Run();
LAB_00114a61:
    Run();
LAB_00114a66:
    Run();
LAB_00114a6b:
    Run();
LAB_00114a70:
    Run();
LAB_00114a75:
    Run();
LAB_00114a7a:
    Run();
LAB_00114a7f:
    Run();
LAB_00114a84:
    Run();
LAB_00114a89:
    Run();
LAB_00114a8e:
    Run();
LAB_00114a93:
    Run();
LAB_00114a98:
    Run();
LAB_00114a9d:
    Run();
LAB_00114aa2:
    Run();
LAB_00114aa7:
    Run();
LAB_00114aac:
    Run();
LAB_00114ab1:
    Run();
LAB_00114ab6:
    Run();
LAB_00114abb:
    Run();
LAB_00114ac0:
    Run();
LAB_00114ac5:
    Run();
LAB_00114aca:
    Run();
LAB_00114acf:
    Run();
LAB_00114ad4:
    Run();
LAB_00114ad9:
    Run();
LAB_00114ade:
    Run();
LAB_00114ae3:
    Run();
LAB_00114ae8:
    Run();
LAB_00114aed:
    Run();
LAB_00114af2:
    Run();
LAB_00114af7:
    Run();
LAB_00114afc:
    Run();
LAB_00114b01:
    Run();
LAB_00114b06:
    Run();
LAB_00114b0b:
    Run();
LAB_00114b10:
    Run();
LAB_00114b15:
    Run();
LAB_00114b1a:
    Run();
LAB_00114b1f:
    Run();
LAB_00114b24:
    Run();
LAB_00114b29:
    Run();
LAB_00114b2e:
    Run();
LAB_00114b33:
    Run();
LAB_00114b38:
    Run();
  }
  else {
    if (*(undefined8 **)(lVar2 + 0x28) != &ctemplate::html_escape) goto LAB_00114a1b;
    lVar2 = ctemplate::FindModifier("h",1,"",0);
    if (lVar2 == 0) goto LAB_00114a20;
    if (*(undefined8 **)(lVar2 + 0x28) != &ctemplate::html_escape) goto LAB_00114a25;
    lVar2 = ctemplate::FindModifier("html_escape_with_arg",0x14,"=pre",4);
    if (lVar2 == 0) goto LAB_00114a2a;
    if (*(undefined8 **)(lVar2 + 0x28) != &ctemplate::pre_escape) goto LAB_00114a2f;
    lVar2 = ctemplate::FindModifier("H",1,"=pre",4);
    if (lVar2 == 0) goto LAB_00114a34;
    if (*(undefined8 **)(lVar2 + 0x28) != &ctemplate::pre_escape) goto LAB_00114a39;
    lVar2 = ctemplate::FindModifier("javascript_escape_with_arg",0x1a,"=number",7);
    if (lVar2 == 0) goto LAB_00114a3e;
    lVar2 = ctemplate::FindModifier("J",1,"=number",7);
    if (lVar2 == 0) goto LAB_00114a43;
    if (*(undefined8 **)(lVar2 + 0x28) != &ctemplate::javascript_number) goto LAB_00114a48;
    lVar2 = ctemplate::FindModifier("H",1,"=pre",2);
    if (lVar2 != 0) goto LAB_00114a4d;
    lVar2 = ctemplate::FindModifier("H",1,"=pree",5);
    if (lVar2 != 0) goto LAB_00114a52;
    lVar2 = ctemplate::FindModifier("H",1,"=notpresent",0xb);
    if (lVar2 != 0) goto LAB_00114a57;
    lVar2 = ctemplate::FindModifier("html_escape",0xb,"=p",2);
    if (lVar2 != 0) goto LAB_00114a5c;
    lVar2 = ctemplate::FindModifier("h",1,"=p",2);
    if (lVar2 != 0) goto LAB_00114a61;
    lVar2 = ctemplate::FindModifier("html_escape_with_arg",0x14,"",0);
    if (lVar2 != 0) goto LAB_00114a66;
    lVar2 = ctemplate::FindModifier("H",1,"",0);
    if (lVar2 != 0) goto LAB_00114a6b;
    local_30 = ctemplate::GetDefaultModifierForXml;
    local_40 = ctemplate::GetDefaultModifierForXml;
    local_48 = ctemplate::GetDefaultModifierForXml;
    local_50 = ctemplate::GetDefaultModifierForXml;
    cVar1 = ctemplate::AddModifier("x-test",(TemplateModifier *)&local_30);
    if (cVar1 == '\0') goto LAB_00114a70;
    cVar1 = ctemplate::AddModifier("x-test-arg=",(TemplateModifier *)&local_40);
    if (cVar1 == '\0') goto LAB_00114a75;
    cVar1 = ctemplate::AddModifier("x-test-arg=h",(TemplateModifier *)&local_48);
    if (cVar1 == '\0') goto LAB_00114a7a;
    cVar1 = ctemplate::AddModifier("x-test-arg=json",(TemplateModifier *)&local_50);
    if (cVar1 == '\0') goto LAB_00114a7f;
    lVar2 = ctemplate::FindModifier("x-test",6,"",0);
    if (lVar2 == 0) goto LAB_00114a84;
    if (*(char *)(lVar2 + 0x22) == '\0') goto LAB_00114a89;
    if (*(TemplateModifier **)(lVar2 + 0x28) != (TemplateModifier *)&local_30) goto LAB_00114a8e;
    if (*(int *)(lVar2 + 0x24) != 2) goto LAB_00114a93;
    lVar2 = ctemplate::FindModifier("x-test",6,"=h",2);
    if (lVar2 == 0) goto LAB_00114a98;
    if (*(char *)(lVar2 + 0x22) == '\x01') goto LAB_00114a9d;
    lVar2 = ctemplate::FindModifier("x-test-arg",10,"=p",2);
    if (lVar2 == 0) goto LAB_00114aa2;
    if (*(char *)(lVar2 + 0x22) == '\0') goto LAB_00114aa7;
    if (*(TemplateModifier **)(lVar2 + 0x28) != (TemplateModifier *)&local_40) goto LAB_00114aac;
    lVar2 = ctemplate::FindModifier("x-test-arg",10,"=h",2);
    if (lVar2 == 0) goto LAB_00114ab1;
    if (*(char *)(lVar2 + 0x22) == '\0') goto LAB_00114ab6;
    if (*(TemplateModifier **)(lVar2 + 0x28) != (TemplateModifier *)&local_48) goto LAB_00114abb;
    lVar2 = ctemplate::FindModifier("x-test-arg",10,"=html",5);
    if (lVar2 == 0) goto LAB_00114ac0;
    if (*(char *)(lVar2 + 0x22) == '\0') goto LAB_00114ac5;
    if (*(TemplateModifier **)(lVar2 + 0x28) != (TemplateModifier *)&local_40) goto LAB_00114aca;
    lVar2 = ctemplate::FindModifier("x-test-arg",10,"=json",5);
    if (lVar2 == 0) goto LAB_00114acf;
    if (*(char *)(lVar2 + 0x22) == '\0') goto LAB_00114ad4;
    if (*(TemplateModifier **)(lVar2 + 0x28) != (TemplateModifier *)&local_50) goto LAB_00114ad9;
    lVar2 = ctemplate::FindModifier("x-test-arg",10,"json",4);
    if (lVar2 == 0) goto LAB_00114ade;
    if (*(char *)(lVar2 + 0x22) == '\0') goto LAB_00114ae3;
    if (*(TemplateModifier **)(lVar2 + 0x28) != (TemplateModifier *)&local_40) goto LAB_00114ae8;
    lVar2 = ctemplate::FindModifier("x-test-arg",10,"=jsonnabbe",5);
    if (lVar2 == 0) goto LAB_00114aed;
    if (*(char *)(lVar2 + 0x22) == '\0') goto LAB_00114af2;
    if (*(TemplateModifier **)(lVar2 + 0x28) != (TemplateModifier *)&local_50) goto LAB_00114af7;
    lVar2 = ctemplate::FindModifier("x-test-arg",10,"=jsonnabbe",6);
    if (lVar2 == 0) goto LAB_00114afc;
    if (*(char *)(lVar2 + 0x22) == '\0') goto LAB_00114b01;
    if (*(TemplateModifier **)(lVar2 + 0x28) != (TemplateModifier *)&local_40) goto LAB_00114b06;
    lVar2 = ctemplate::FindModifier("x-test-arg",10,"=jsonnabbe",4);
    if (lVar2 == 0) goto LAB_00114b0b;
    if (*(char *)(lVar2 + 0x22) == '\0') goto LAB_00114b10;
    if (*(TemplateModifier **)(lVar2 + 0x28) != (TemplateModifier *)&local_40) goto LAB_00114b15;
    lVar2 = ctemplate::FindModifier("x-foo",5,"",0);
    if (lVar2 == 0) goto LAB_00114b1a;
    if (*(char *)(lVar2 + 0x22) == '\x01') goto LAB_00114b1f;
    lVar2 = ctemplate::FindModifier("x-bar",5,"=p",2);
    if (lVar2 == 0) goto LAB_00114b24;
    if (*(char *)(lVar2 + 0x22) == '\x01') goto LAB_00114b29;
    local_38 = ctemplate::GetDefaultModifierForXml;
    cVar1 = ctemplate::AddXssSafeModifier("x-safetest",(TemplateModifier *)&local_38);
    if (cVar1 == '\0') goto LAB_00114b2e;
    lVar2 = ctemplate::FindModifier("x-safetest",10,"",0);
    if (lVar2 == 0) goto LAB_00114b33;
    if (*(char *)(lVar2 + 0x22) == '\0') goto LAB_00114b38;
    if (*(int *)(lVar2 + 0x24) == 3) {
      if (*(TemplateModifier **)(lVar2 + 0x28) == (TemplateModifier *)&local_38) {
        ctemplate::TemplateModifier::~TemplateModifier((TemplateModifier *)&local_38);
        ctemplate::TemplateModifier::~TemplateModifier((TemplateModifier *)&local_50);
        ctemplate::TemplateModifier::~TemplateModifier((TemplateModifier *)&local_48);
        ctemplate::TemplateModifier::~TemplateModifier((TemplateModifier *)&local_40);
        ctemplate::TemplateModifier::~TemplateModifier((TemplateModifier *)&local_30);
        return;
      }
      goto LAB_00114b42;
    }
  }
  Run();
LAB_00114b42:
  Run();
  ctemplate::TemplateModifier::~TemplateModifier((TemplateModifier *)&local_38);
  ctemplate::TemplateModifier::~TemplateModifier((TemplateModifier *)&local_50);
  ctemplate::TemplateModifier::~TemplateModifier((TemplateModifier *)&local_48);
  ctemplate::TemplateModifier::~TemplateModifier((TemplateModifier *)&local_40);
  ctemplate::TemplateModifier::~TemplateModifier((TemplateModifier *)&local_30);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(TemplateModifiers, FindModifier) {
  const GOOGLE_NAMESPACE::ModifierInfo* info;
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("html_escape", 11, "", 0)));
  EXPECT_EQ(info->modifier, &GOOGLE_NAMESPACE::html_escape);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("h", 1, "", 0)));
  EXPECT_EQ(info->modifier, &GOOGLE_NAMESPACE::html_escape);

  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("html_escape_with_arg", 20,
                                              "=pre", 4)));
  EXPECT_EQ(info->modifier, &GOOGLE_NAMESPACE::pre_escape);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("H", 1, "=pre", 4)));
  EXPECT_EQ(info->modifier, &GOOGLE_NAMESPACE::pre_escape);

  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("javascript_escape_with_arg",
                                              26, "=number", 7)));
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("J", 1, "=number", 7)));
  EXPECT_EQ(info->modifier, &GOOGLE_NAMESPACE::javascript_number);

  // html_escape_with_arg doesn't have a default value, so these should fail.
  EXPECT_FALSE(GOOGLE_NAMESPACE::FindModifier("H", 1, "=pre", 2));  // "=p"
  EXPECT_FALSE(GOOGLE_NAMESPACE::FindModifier("H", 1, "=pree", 5));
  EXPECT_FALSE(GOOGLE_NAMESPACE::FindModifier("H", 1, "=notpresent", 11));

  // If we don't have a modifier-value when we ought, we should fail.
  EXPECT_FALSE(GOOGLE_NAMESPACE::FindModifier("html_escape", 11, "=p", 2));
  EXPECT_FALSE(GOOGLE_NAMESPACE::FindModifier("h", 1, "=p", 2));

  EXPECT_FALSE(GOOGLE_NAMESPACE::FindModifier("html_escape_with_arg", 20,
                                       "", 0));
  EXPECT_FALSE(GOOGLE_NAMESPACE::FindModifier("H", 1, "", 0));

  // Test with added modifiers as well.
  GOOGLE_NAMESPACE::NullModifier foo_modifier1;
  GOOGLE_NAMESPACE::NullModifier foo_modifier2;
  GOOGLE_NAMESPACE::NullModifier foo_modifier3;
  GOOGLE_NAMESPACE::NullModifier foo_modifier4;
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-test", &foo_modifier1));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-test-arg=", &foo_modifier2));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-test-arg=h", &foo_modifier3));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-test-arg=json", &foo_modifier4));

  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test", 6, "", 0)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->modifier, &foo_modifier1);
  EXPECT_EQ(info->xss_class, GOOGLE_NAMESPACE::XSS_UNIQUE);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test", 6, "=h", 2)));
  EXPECT_FALSE(info->is_registered);
  // This tests default values
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test-arg", 10, "=p", 2)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->modifier, &foo_modifier2);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test-arg", 10, "=h", 2)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->modifier, &foo_modifier3);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test-arg", 10, "=html", 5)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->modifier, &foo_modifier2);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test-arg", 10, "=json", 5)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->modifier, &foo_modifier4);
  // The value is required to start with an '=' to match the
  // specialization.  If it doesn't, it will match the default.
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test-arg", 10, "json", 4)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->modifier, &foo_modifier2);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test-arg", 10,
                                              "=jsonnabbe", 5)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->modifier, &foo_modifier4);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test-arg", 10,
                                              "=jsonnabbe", 6)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->modifier, &foo_modifier2);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test-arg", 10,
                                              "=jsonnabbe", 4)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->modifier, &foo_modifier2);

  // If we try to find an x- modifier that wasn't added, we should get
  // a legit but "unknown" modifier back.
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-foo", 5, "", 0)));
  EXPECT_FALSE(info->is_registered);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-bar", 5, "=p", 2)));
  EXPECT_FALSE(info->is_registered);

  // Basic test with added XssSafe modifier.
  GOOGLE_NAMESPACE::NullModifier foo_modifier5;
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-safetest",
                                            &foo_modifier5));
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-safetest", 10, "", 0)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->xss_class, GOOGLE_NAMESPACE::XSS_SAFE);
  EXPECT_EQ(info->modifier, &foo_modifier5);
}